

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void hash_table_maybe_grow(size_t new_n,hash_table_t *hash_table)

{
  ulong uVar1;
  hash_table_entry_t *phVar2;
  long *in_FS_OFFSET;
  size_t local_88;
  hash_table_entry_t *entry;
  size_t i;
  hash_table_t new_hash_table;
  size_t new_capacity;
  hash_table_t *hash_table_local;
  size_t new_n_local;
  
  if (hash_table->capacity < new_n) {
    uVar1 = hash_table->capacity * 2;
    local_88 = new_n;
    if (new_n <= uVar1 && uVar1 - new_n != 0) {
      local_88 = hash_table->capacity;
    }
    new_hash_table.n = local_88 << 1;
    i = (size_t)rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),hash_table->hashes,
                                   (int)((long)new_hash_table.entries << 3),(int)(local_88 << 4));
    hash_table->hashes = (unsigned_long *)i;
    new_hash_table.hashes =
         (unsigned_long *)
         rf_calloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),new_hash_table.n,0x20);
    new_hash_table.entries = (hash_table_entry_t *)new_hash_table.n;
    new_hash_table.capacity = hash_table->n;
    for (entry = (hash_table_entry_t *)0x0; entry < (hash_table_entry_t *)hash_table->capacity;
        entry = (hash_table_entry_t *)((long)&entry->hash + 1)) {
      phVar2 = hash_table_find(hash_table->hashes[(long)entry],hash_table);
      hash_table_insert_value(hash_table->hashes[(long)entry],phVar2->value,(hash_table_t *)&i);
    }
    (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
    hash_table->hashes = (unsigned_long *)i;
    hash_table->entries = (hash_table_entry_t *)new_hash_table.hashes;
    hash_table->capacity = (size_t)new_hash_table.entries;
    hash_table->n = new_hash_table.capacity;
  }
  return;
}

Assistant:

static void hash_table_maybe_grow(size_t new_n, hash_table_t* hash_table)
{
  size_t new_capacity;
  hash_table_t new_hash_table;
  size_t i;

  if (new_n <= hash_table->capacity) {
    return;
  }
  new_capacity = 2 * ((2 * hash_table->capacity) > new_n ? hash_table->capacity : new_n);
  /* Create a new hash table. We're not calling create_hash_table because we want to realloc the hash array */
  new_hash_table.hashes = hash_table->hashes = (unsigned long*) TINYOBJ_REALLOC((void*) hash_table->hashes, sizeof(unsigned long) * new_hash_table.capacity, sizeof(unsigned long) * new_capacity);
  new_hash_table.entries = (hash_table_entry_t*) TINYOBJ_CALLOC(new_capacity, sizeof(hash_table_entry_t));
  new_hash_table.capacity = new_capacity;
  new_hash_table.n = hash_table->n;

  /* Rehash */
  for (i = 0; i < hash_table->capacity; i++)
  {
    hash_table_entry_t* entry = hash_table_find(hash_table->hashes[i], hash_table);
    hash_table_insert_value(hash_table->hashes[i], entry->value, &new_hash_table);
  }

  TINYOBJ_FREE(hash_table->entries);
  (*hash_table) = new_hash_table;
}